

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

string * __thiscall
toml::detail::region::line_num_abi_cxx11_(string *__return_storage_ptr__,region *this)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  string *__str;
  uint __len;
  long lVar6;
  ulong uVar7;
  ulong __val;
  
  pcVar1 = (this->first_)._M_current;
  pcVar4 = (((this->source_).
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 == pcVar1) {
    uVar7 = 1;
  }
  else {
    lVar6 = 0;
    do {
      lVar6 = lVar6 + (ulong)(*pcVar4 == '\n');
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != pcVar1);
    uVar7 = lVar6 + 1;
  }
  __val = -uVar7;
  if (0 < (long)uVar7) {
    __val = uVar7;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00125bf4;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00125bf4;
      }
      if (uVar5 < 10000) goto LAB_00125bf4;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_00125bf4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)((long)uVar7 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar7 >> 0x3f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string line_num() const override
    {
        return std::to_string(1 + std::count(this->begin(), this->first(), '\n'));
    }